

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

size_t rtosc_print_arg_vals
                 (rtosc_arg_val_t *args,size_t n,char *buffer,size_t bs,rtosc_print_options *opt,
                 int cols_used)

{
  char cVar1;
  int iVar2;
  long lVar3;
  rtosc_arg_val_t *prev_arg_if_range;
  rtosc_arg_val_t *arg;
  rtosc_print_options *opt_00;
  rtosc_print_options *bs_00;
  size_t buffer_00;
  char *pcVar4;
  rtosc_arg_val_t *prVar5;
  size_t asStack_f0 [2];
  size_t sStack_e0;
  undefined1 auStack_d8 [16];
  rtosc_arg_val_t *local_c8 [2];
  size_t local_b8;
  rtosc_print_options *local_b0;
  rtosc_print_options *local_a8;
  rtosc_arg_val_t *local_a0;
  rtosc_arg_val_t *local_98;
  long local_90;
  size_t inc;
  size_t tmp;
  rtosc_arg_val_t *input;
  char *pcStack_70;
  int32_t conv;
  size_t i;
  unsigned_long __vla_expr0;
  size_t local_58;
  char *last_sep;
  size_t sep_len;
  char *pcStack_40;
  int args_written_this_line;
  size_t wrt;
  rtosc_print_options *prStack_30;
  int cols_used_local;
  rtosc_print_options *opt_local;
  size_t bs_local;
  char *buffer_local;
  size_t n_local;
  rtosc_arg_val_t *args_local;
  
  pcStack_40 = (char *)0x0;
  sep_len._4_4_ = (uint)(cols_used != 0);
  prStack_30 = opt;
  if (opt == (rtosc_print_options *)0x0) {
    prStack_30 = default_print_options;
  }
  sStack_e0 = 0x11ccfd;
  wrt._4_4_ = cols_used;
  opt_local = (rtosc_print_options *)bs;
  bs_local = (size_t)buffer;
  buffer_local = (char *)n;
  n_local = (size_t)args;
  last_sep = (char *)strlen(prStack_30->sep);
  local_58 = bs_local - 1;
  __vla_expr0 = (unsigned_long)auStack_d8;
  lVar3 = -((long)buffer_local * 0x18 + 0xfU & 0xfffffffffffffff0);
  prVar5 = (rtosc_arg_val_t *)(auStack_d8 + lVar3);
  local_98 = prVar5;
  i = (size_t)buffer_local;
  pcStack_70 = (char *)0x0;
  while (pcStack_70 < buffer_local) {
    *(undefined8 *)(auStack_d8 + lVar3 + -8) = 0x11cd6d;
    input._4_4_ = rtosc_convert_to_range
                            (*(rtosc_arg_val_t **)((long)&opt_local + lVar3),
                             *(size_t *)((long)&stack0xffffffffffffffd0 + lVar3),
                             *(rtosc_arg_val_t **)((long)&wrt + lVar3),
                             *(rtosc_print_options **)((long)&stack0xffffffffffffffc0 + lVar3));
    buffer_00 = bs_local;
    bs_00 = opt_local;
    opt_00 = prStack_30;
    if (input._4_4_ == 0) {
      local_a0 = (rtosc_arg_val_t *)n_local;
    }
    else {
      local_a0 = local_98;
    }
    arg = local_a0;
    tmp = (size_t)local_a0;
    local_c8[1] = local_a0;
    local_b8 = bs_local;
    local_b0 = opt_local;
    local_a8 = prStack_30;
    if (pcStack_70 == (char *)0x0) {
      local_c8[0] = (rtosc_arg_val_t *)0x0;
    }
    else {
      local_c8[0] = (rtosc_arg_val_t *)(n_local - 0x18);
    }
    prev_arg_if_range = local_c8[0];
    *(undefined8 *)(auStack_d8 + lVar3 + -8) = 0x11ce15;
    inc = rtosc_print_arg_val(arg,(char *)buffer_00,(size_t)bs_00,opt_00,(int *)((long)&wrt + 4),
                              prev_arg_if_range);
    pcStack_40 = pcStack_40 + inc;
    bs_local = inc + bs_local;
    opt_local = (rtosc_print_options *)((long)opt_local - inc);
    cVar1 = *(char *)n_local;
    *(undefined8 *)(auStack_d8 + lVar3 + -8) = 0x11ce53;
    pcVar4 = strchr("-asb",(int)cVar1);
    if (pcVar4 == (char *)0x0) {
      iVar2 = prStack_30->linelength;
      *(long *)((long)asStack_f0 + lVar3 + 8) = (long)&sep_len + 4;
      *(int *)(auStack_d8 + lVar3 + -8) = iVar2;
      *(undefined8 *)((long)asStack_f0 + lVar3) = 0x11ce8d;
      linebreak_check_after_write
                (*(int **)((long)local_c8 + lVar3 + 8),*(size_t **)((long)local_c8 + lVar3),
                 *(char **)(auStack_d8 + lVar3 + 8),*(char ***)prVar5,
                 *(size_t **)(auStack_d8 + lVar3 + -8),*(size_t *)((long)asStack_f0 + lVar3 + 8),
                 *(int **)((long)&local_b0 + lVar3),*(int *)((long)&local_a8 + lVar3));
    }
    if (input._4_4_ == 0) {
      *(undefined8 *)(auStack_d8 + lVar3 + -8) = 0x11ceab;
      auStack_d8._12_4_ = next_arg_offset(*(rtosc_arg_val_t **)(auStack_d8 + lVar3 + 8));
    }
    else {
      auStack_d8._12_4_ = input._4_4_;
    }
    local_90 = (long)(int)auStack_d8._12_4_;
    pcStack_70 = pcStack_70 + local_90;
    n_local = local_90 * 0x18 + n_local;
    if (pcStack_70 < buffer_local) {
      local_58 = bs_local;
      *(undefined8 *)(auStack_d8 + lVar3 + -8) = 0x11cf09;
      fast_strcpy(*(char **)(auStack_d8 + lVar3 + 8),*(char **)prVar5,
                  *(size_t *)(auStack_d8 + lVar3 + -8));
      wrt._4_4_ = wrt._4_4_ + (int)last_sep;
      pcStack_40 = last_sep + (long)pcStack_40;
      bs_local = (size_t)(last_sep + bs_local);
      opt_local = (rtosc_print_options *)((long)opt_local - (long)last_sep);
    }
  }
  return (size_t)pcStack_40;
}

Assistant:

size_t rtosc_print_arg_vals(const rtosc_arg_val_t *args, size_t n,
                            char *buffer, size_t bs,
                            const rtosc_print_options *opt, int cols_used)
{
    size_t wrt=0;
    int args_written_this_line = (cols_used) ? 1 : 0;
    if(!opt)
        opt = default_print_options;
    size_t sep_len = strlen(opt->sep);
    char* last_sep = buffer - 1;
    STACKALLOC(rtosc_arg_val_t, args_converted, n); // only used for range conversion

    for(size_t i = 0; i < n;)
    {
        int32_t conv = rtosc_convert_to_range(args, n-i, args_converted, opt);
        const rtosc_arg_val_t* input = conv ? args_converted : args;

        size_t tmp = rtosc_print_arg_val(input, buffer, bs, opt, &cols_used, (i == 0) ? NULL : (args-1));
        wrt += tmp;
        buffer += tmp;
        bs -= tmp;

        // these compute the newlines themselves
        if(! strchr("-asb", args->type))
        linebreak_check_after_write(&cols_used, &wrt, last_sep, &buffer, &bs,
                                    tmp, &args_written_this_line,
                                    opt->linelength);

        size_t inc = conv ? conv : next_arg_offset(args);
        i += inc;
        args += inc;
        if(i<n)
        {
            assert(sep_len < bs);
            last_sep = buffer;
            fast_strcpy(buffer, opt->sep, bs);
            cols_used += sep_len;
            wrt += sep_len;
            buffer += sep_len;
            bs -= sep_len;
        }
    }
    return wrt;
}